

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::DefinedFunc::DoCall
          (DefinedFunc *this,Thread *thread,Values *params,Values *results,Ptr *out_trap)

{
  RunResult RVar1;
  size_type sVar2;
  size_type sVar3;
  RunResult result;
  Ptr *out_trap_local;
  Values *results_local;
  Values *params_local;
  Thread *thread_local;
  DefinedFunc *this_local;
  
  sVar2 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size(params);
  sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                    (&(this->super_Func).type_.params);
  if (sVar2 == sVar3) {
    Thread::PushValues(thread,&(this->super_Func).type_.params,params);
    RVar1 = Thread::PushCall(thread,this,out_trap);
    if (RVar1 == Trap) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar1 = Thread::Run(thread,out_trap);
      if (RVar1 == Trap) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Thread::PopValues(thread,&(this->super_Func).type_.results,results);
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
    return (Result)this_local._4_4_;
  }
  __assert_fail("params.size() == type_.params.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp.cc"
                ,0x18a,
                "virtual Result wabt::interp::DefinedFunc::DoCall(Thread &, const Values &, Values &, Trap::Ptr *)"
               );
}

Assistant:

Result DefinedFunc::DoCall(Thread& thread,
                           const Values& params,
                           Values& results,
                           Trap::Ptr* out_trap) {
  assert(params.size() == type_.params.size());
  thread.PushValues(type_.params, params);
  RunResult result = thread.PushCall(*this, out_trap);
  if (result == RunResult::Trap) {
    return Result::Error;
  }
  result = thread.Run(out_trap);
  if (result == RunResult::Trap) {
    return Result::Error;
  }
  thread.PopValues(type_.results, &results);
  return Result::Ok;
}